

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

void __thiscall
FlowGraph::BuildLoop(FlowGraph *this,BasicBlock *headBlock,BasicBlock *tailBlock,Loop *parentLoop)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  ImplicitCallFlags newFlags;
  LabelInstr *pLVar3;
  undefined4 *puVar4;
  Loop *this_00;
  BasicBlock *pBVar5;
  ProfiledLabelInstr *pPVar6;
  JITTimeProfileInfo *pJVar7;
  undefined1 local_b8 [8];
  NoRecoverMemoryJitArenaAllocator tempAlloc;
  
  if (this->func->m_isBackgroundJIT == false) {
    scriptContext = (ScriptContext *)this->func->m_scriptContextInfo;
    ThreadContext::ProbeStackNoDispose(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  }
  if (tailBlock->number < headBlock->number) {
    *(ushort *)&headBlock->field_0x18 = *(ushort *)&headBlock->field_0x18 & 0xfffb;
    pLVar3 = IR::Instr::AsLabelInstr(headBlock->firstInstr);
    pLVar3->field_0x78 = pLVar3->field_0x78 & 0xfe;
  }
  else {
    if ((*(ushort *)&headBlock->field_0x18 & 4) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x4ff,"(headBlock->isLoopHeader)","headBlock->isLoopHeader");
      if (!bVar2) goto LAB_003fafb7;
      *puVar4 = 0;
    }
    this_00 = (Loop *)new<Memory::JitArenaAllocator>(0x1d8,this->func->m_alloc,0x3d70ba);
    Loop::Loop(this_00,this->func->m_alloc,this->func);
    this_00->next = this->loopList;
    this->loopList = this_00;
    headBlock->loop = this_00;
    this_00->headBlock = headBlock;
    this_00->int32SymsOnEntry = (BVSparse<Memory::JitArenaAllocator> *)0x0;
    this_00->lossyInt32SymsOnEntry = (BVSparse<Memory::JitArenaAllocator> *)0x0;
    if ((parentLoop != (Loop *)0x0) && (parentLoop->headBlock->number < headBlock->number)) {
      this_00->parent = parentLoop;
      parentLoop->field_0x179 = parentLoop->field_0x179 & 0xfe;
    }
    this_00->memOpInfo = (MemOpInfo *)0x0;
    *(ushort *)&this_00->field_0x178 = (ushort)*(undefined4 *)&this_00->field_0x178 & 0xfbf9 | 0x400
    ;
    Memory::NoRecoverMemoryJitArenaAllocator::NoRecoverMemoryJitArenaAllocator
              ((NoRecoverMemoryJitArenaAllocator *)local_b8,L"BE-LoopBuilder",
               (this->func->m_alloc->super_ArenaAllocator).
               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
               super_ArenaData.pageAllocator,Js::Throw::OutOfMemory);
    WalkLoopBlocks(this,tailBlock,this_00,(JitArenaAllocator *)local_b8);
    pBVar5 = Loop::GetHeadBlock(this_00);
    if (pBVar5 != headBlock) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x517,"(loop->GetHeadBlock() == headBlock)",
                         "loop->GetHeadBlock() == headBlock");
      if (!bVar2) {
LAB_003fafb7:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    pLVar3 = Loop::GetLoopTopInstr(this_00);
    IR::LabelInstr::SetLoop(pLVar3,this_00);
    if ((pLVar3->super_Instr).m_kind == InstrKindProfiledLabel) {
      pPVar6 = IR::Instr::AsProfiledLabelInstr(&pLVar3->super_Instr);
      Loop::SetImplicitCallFlags(this_00,pPVar6->loopImplicitCallFlags);
      bVar2 = Func::HasProfileInfo(this->func);
      if (bVar2) {
        pJVar7 = Func::GetReadOnlyProfileInfo(this->func);
        bVar2 = JITTimeProfileInfo::IsLoopImplicitCallInfoDisabled(pJVar7);
        if (bVar2) {
          pJVar7 = Func::GetReadOnlyProfileInfo(this->func);
          newFlags = JITTimeProfileInfo::GetImplicitCallFlags(pJVar7);
          Loop::SetImplicitCallFlags(this_00,newFlags);
        }
      }
      pPVar6 = IR::Instr::AsProfiledLabelInstr(&pLVar3->super_Instr);
      this_00->loopFlags = pPVar6->loopFlags;
    }
    else {
      Loop::SetImplicitCallFlags(this_00,ImplicitCall_All);
    }
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
              ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)local_b8);
  }
  return;
}

Assistant:

void
FlowGraph::BuildLoop(BasicBlock *headBlock, BasicBlock *tailBlock, Loop *parentLoop)
{
    // This function is recursive, so when jitting in the foreground, probe the stack
    if(!func->IsBackgroundJIT())
    {
        PROBE_STACK_NO_DISPOSE(func->GetScriptContext(), Js::Constants::MinStackDefault);
    }

    if (tailBlock->number < headBlock->number)
    {
        // Not a loop.  We didn't see any back-edge.
        headBlock->isLoopHeader = false;
        headBlock->GetFirstInstr()->AsLabelInstr()->m_isLoopTop = false;
        return;
    }

    Assert(headBlock->isLoopHeader);
    Loop *loop = JitAnewZ(this->GetFunc()->m_alloc, Loop, this->GetFunc()->m_alloc, this->GetFunc());
    loop->next = this->loopList;
    this->loopList = loop;
    headBlock->loop = loop;
    loop->headBlock = headBlock;
    loop->int32SymsOnEntry = nullptr;
    loop->lossyInt32SymsOnEntry = nullptr;

    // If parentLoop is a parent of loop, it's headBlock better appear first.
    if (parentLoop && loop->headBlock->number > parentLoop->headBlock->number)
    {
        loop->parent = parentLoop;
        parentLoop->isLeaf = false;
    }
    loop->hasDeadStoreCollectionPass = false;
    loop->hasDeadStorePrepass = false;
    loop->memOpInfo = nullptr;
    loop->doMemOp = true;

    NoRecoverMemoryJitArenaAllocator tempAlloc(_u("BE-LoopBuilder"), this->func->m_alloc->GetPageAllocator(), Js::Throw::OutOfMemory);

    WalkLoopBlocks(tailBlock, loop, &tempAlloc);

    Assert(loop->GetHeadBlock() == headBlock);

    IR::LabelInstr * firstInstr = loop->GetLoopTopInstr();

    firstInstr->SetLoop(loop);

    if (firstInstr->IsProfiledLabelInstr())
    {
        loop->SetImplicitCallFlags(firstInstr->AsProfiledLabelInstr()->loopImplicitCallFlags);
        if (this->func->HasProfileInfo() && this->func->GetReadOnlyProfileInfo()->IsLoopImplicitCallInfoDisabled())
        {
            loop->SetImplicitCallFlags(this->func->GetReadOnlyProfileInfo()->GetImplicitCallFlags());
        }
        loop->SetLoopFlags(firstInstr->AsProfiledLabelInstr()->loopFlags);
    }
    else
    {
        // Didn't collect profile information, don't do optimizations
        loop->SetImplicitCallFlags(Js::ImplicitCall_All);
    }
}